

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<vkb::detail::SurfaceSupportDetails> *
vkb::detail::query_surface_support_details
          (Result<vkb::detail::SurfaceSupportDetails> *__return_storage_ptr__,
          VkPhysicalDevice phys_device,VkSurfaceKHR surface)

{
  VkResult result;
  VulkanFunctions *pVVar1;
  error_code eVar2;
  error_code error_code;
  error_code error_code_00;
  error_code error_code_01;
  undefined1 local_158 [48];
  VkSurfaceTransformFlagBitsKHR local_128;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_120;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_108;
  uint local_e8;
  error_category *local_e0;
  VkResult local_d8;
  undefined4 local_d4;
  VkResult present_modes_ret;
  error_category *local_c8;
  VkResult local_ac;
  undefined1 local_a8 [4];
  VkResult formats_ret;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> formats;
  undefined1 auStack_64 [4];
  VkResult res;
  VkSurfaceCapabilitiesKHR capabilities;
  VkSurfaceKHR local_20;
  VkSurfaceKHR surface_local;
  VkPhysicalDevice phys_device_local;
  
  local_20 = surface;
  surface_local = (VkSurfaceKHR)phys_device;
  phys_device_local = (VkPhysicalDevice)__return_storage_ptr__;
  if (surface == (VkSurfaceKHR)0x0) {
    eVar2 = make_error_code(surface_handle_null);
    error_code._M_cat = eVar2._M_cat;
    capabilities.supportedCompositeAlpha = eVar2._M_value;
    error_code._4_4_ = 0;
    error_code._M_value = capabilities.supportedCompositeAlpha;
    Result<vkb::detail::SurfaceSupportDetails>::Result(__return_storage_ptr__,error_code,VK_SUCCESS)
    ;
  }
  else {
    pVVar1 = vulkan_functions();
    result = (*pVVar1->fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                       ((VkPhysicalDevice)surface_local,local_20,
                        (VkSurfaceCapabilitiesKHR *)auStack_64);
    if (result == VK_SUCCESS) {
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
                ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                 &present_modes.
                  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_a8);
      pVVar1 = vulkan_functions();
      local_ac = get_vector<VkSurfaceFormatKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkSurfaceFormatKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                           ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                            &present_modes.
                             super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkSurfaceFormatKHR_ptr
                             **)&pVVar1->fp_vkGetPhysicalDeviceSurfaceFormatsKHR,
                            (VkPhysicalDevice_T **)&surface_local,&local_20);
      if (local_ac == VK_SUCCESS) {
        pVVar1 = vulkan_functions();
        local_d8 = get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                             ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
                              local_a8,(_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                                        **)&pVVar1->fp_vkGetPhysicalDeviceSurfacePresentModesKHR,
                              (VkPhysicalDevice_T **)&surface_local,&local_20);
        if (local_d8 == VK_SUCCESS) {
          local_128 = capabilities.currentTransform;
          local_158._32_4_ = capabilities.maxImageExtent.width;
          local_158._36_4_ = capabilities.maxImageExtent.height;
          local_158._40_4_ = capabilities.maxImageArrayLayers;
          local_158._44_4_ = capabilities.supportedTransforms;
          local_158._16_4_ = capabilities.currentExtent.width;
          local_158._20_4_ = capabilities.currentExtent.height;
          local_158._24_4_ = capabilities.minImageExtent.width;
          local_158._28_4_ = capabilities.minImageExtent.height;
          local_158._0_4_ = auStack_64;
          local_158._4_4_ = res;
          local_158._8_4_ = capabilities.minImageCount;
          local_158._12_4_ = capabilities.maxImageCount;
          std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
                    (&local_120,
                     (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                     &present_modes.
                      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
                    (&local_108,
                     (vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_a8);
          Result<vkb::detail::SurfaceSupportDetails>::Result
                    (__return_storage_ptr__,(SurfaceSupportDetails *)local_158);
          SurfaceSupportDetails::~SurfaceSupportDetails((SurfaceSupportDetails *)local_158);
        }
        else {
          eVar2 = make_error_code(failed_enumerate_present_modes);
          local_e8 = eVar2._M_value;
          eVar2._4_4_ = 0;
          eVar2._M_value = local_e8;
          local_e0 = eVar2._M_cat;
          Result<vkb::detail::SurfaceSupportDetails>::Result(__return_storage_ptr__,eVar2,local_d8);
        }
      }
      else {
        eVar2 = make_error_code(failed_enumerate_surface_formats);
        error_code_01._M_cat = eVar2._M_cat;
        present_modes_ret = eVar2._M_value;
        error_code_01._4_4_ = 0;
        error_code_01._M_value = present_modes_ret;
        local_c8 = error_code_01._M_cat;
        Result<vkb::detail::SurfaceSupportDetails>::Result
                  (__return_storage_ptr__,error_code_01,local_ac);
      }
      local_d4 = 1;
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~vector
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_a8);
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~vector
                ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                 &present_modes.
                  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      eVar2 = make_error_code(failed_get_surface_capabilities);
      error_code_00._M_cat = eVar2._M_cat;
      error_code_00._4_4_ = 0;
      error_code_00._M_value = eVar2._M_value;
      Result<vkb::detail::SurfaceSupportDetails>::Result
                (__return_storage_ptr__,error_code_00,result);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<SurfaceSupportDetails> query_surface_support_details(VkPhysicalDevice phys_device, VkSurfaceKHR surface) {
    if (surface == VK_NULL_HANDLE) return make_error_code(SurfaceSupportError::surface_handle_null);

    VkSurfaceCapabilitiesKHR capabilities;
    VkResult res = detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR(phys_device, surface, &capabilities);
    if (res != VK_SUCCESS) {
        return { make_error_code(SurfaceSupportError::failed_get_surface_capabilities), res };
    }

    std::vector<VkSurfaceFormatKHR> formats;
    std::vector<VkPresentModeKHR> present_modes;

    auto formats_ret = detail::get_vector<VkSurfaceFormatKHR>(
        formats, detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceFormatsKHR, phys_device, surface);
    if (formats_ret != VK_SUCCESS)
        return { make_error_code(SurfaceSupportError::failed_enumerate_surface_formats), formats_ret };
    auto present_modes_ret = detail::get_vector<VkPresentModeKHR>(
        present_modes, detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfacePresentModesKHR, phys_device, surface);
    if (present_modes_ret != VK_SUCCESS)
        return { make_error_code(SurfaceSupportError::failed_enumerate_present_modes), present_modes_ret };

    return SurfaceSupportDetails{ capabilities, formats, present_modes };
}